

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O0

void __thiscall Centaurus::CharClass<wchar_t>::parse(CharClass<wchar_t> *this,Stream *stream)

{
  StreamException *pSVar1;
  CharClass<wchar_t> local_a0;
  Range<wchar_t> *local_80;
  __normal_iterator<Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_78;
  Range<wchar_t> local_70;
  Range<wchar_t> local_60;
  Range<wchar_t> local_50 [2];
  char local_29;
  int local_28;
  wchar_t wStack_24;
  bool escaped;
  anon_enum_32 state;
  wchar_t start;
  bool invert_flag;
  Stream *pSStack_18;
  wchar_t ch;
  Stream *stream_local;
  CharClass<wchar_t> *this_local;
  
  state._3_1_ = CC_STATE_START >> 0x18;
  pSStack_18 = stream;
  stream_local = (Stream *)this;
  start = Stream::get(stream);
  if (start == L'^') {
    state._3_1_ = 1;
    start = Stream::get(pSStack_18);
  }
  wStack_24 = L'\0';
  local_28 = 0;
  while( true ) {
    if (start == L']') {
      if (local_28 == 1) {
        Range<wchar_t>::Range(&local_70,wStack_24,wStack_24 + L'\x01');
        operator|=(this,&local_70);
        Range<wchar_t>::~Range(&local_70);
      }
      else if (local_28 == 2) {
        pSVar1 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(pSVar1,pSStack_18,L']');
        __cxa_throw(pSVar1,&StreamException::typeinfo,StreamException::~StreamException);
      }
      local_78._M_current =
           (Range<wchar_t> *)
           std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
           begin(&this->m_ranges);
      local_80 = (Range<wchar_t> *)
                 std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                 ::end(&this->m_ranges);
      std::
      sort<__gnu_cxx::__normal_iterator<Centaurus::Range<wchar_t>*,std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>>>
                (local_78,(__normal_iterator<Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                           )local_80);
      if ((state._3_1_ & 1) != CC_STATE_START >> 0x18) {
        operator~(&local_a0,this);
        operator=(this,&local_a0);
        ~CharClass(&local_a0);
      }
      return;
    }
    local_29 = '\0';
    if ((start == L'\0') || (start == L'\xffff')) break;
    if (start == L'\\') {
      start = Stream::get(pSStack_18);
      switch(start) {
      case L'-':
        start = L'-';
        break;
      default:
        pSVar1 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(pSVar1,pSStack_18,start);
        __cxa_throw(pSVar1,&StreamException::typeinfo,StreamException::~StreamException);
      case L'N':
      case L'n':
        start = L'\n';
        break;
      case L'R':
      case L'r':
        start = L'\r';
        break;
      case L'T':
      case L't':
        start = L'\t';
        break;
      case L'[':
        start = L'[';
        break;
      case L'\\':
        start = L'\\';
        break;
      case L']':
        start = L']';
      }
      local_29 = '\x01';
    }
    if (local_28 == 0) {
      if ((local_29 == '\0') && (start == L'-')) {
        pSVar1 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(pSVar1,pSStack_18,start);
        __cxa_throw(pSVar1,&StreamException::typeinfo,StreamException::~StreamException);
      }
      wStack_24 = start;
      local_28 = 1;
    }
    else if (local_28 == 1) {
      if ((local_29 == '\0') && (start == L'-')) {
        local_28 = 2;
      }
      else {
        Range<wchar_t>::Range(local_50,wStack_24,wStack_24 + L'\x01');
        operator|=(this,local_50);
        Range<wchar_t>::~Range(local_50);
        wStack_24 = start;
        local_28 = 1;
      }
    }
    else if (local_28 == 2) {
      if ((local_29 == '\0') && (start == L'-')) {
        pSVar1 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::unexpected(pSVar1,pSStack_18,start);
        __cxa_throw(pSVar1,&StreamException::typeinfo,StreamException::~StreamException);
      }
      Range<wchar_t>::Range(&local_60,wStack_24,start + L'\x01');
      operator|=(this,&local_60);
      Range<wchar_t>::~Range(&local_60);
      local_28 = 0;
    }
    start = Stream::get(pSStack_18);
  }
  pSVar1 = (StreamException *)__cxa_allocate_exception(0x28);
  Stream::unexpected(pSVar1,pSStack_18,start);
  __cxa_throw(pSVar1,&StreamException::typeinfo,StreamException::~StreamException);
}

Assistant:

void CharClass<TCHAR>::parse(Stream& stream)
{
    wchar_t ch;
    bool invert_flag = false;

    ch = stream.get();
    if (ch == L'^')
    {
        invert_flag = true;
        ch = stream.get();
    }

    wchar_t start = 0;
    enum
    {
        CC_STATE_START = 0,
        CC_STATE_RANGE,
        CC_STATE_END
    } state = CC_STATE_START;
    for (; ch != L']'; ch = stream.get())
    {
        bool escaped = false;

        if (ch == L'\0' || ch == 0xFFFF)
            throw stream.unexpected(ch);

        if (ch == L'\\')
        {
            ch = stream.get();
            switch (ch)
            {
            case L'\\':
                ch = L'\\';
                break;
            case L'-':
                ch = L'-';
                break;
            case L'[':
                ch = L'[';
                break;
            case L']':
                ch = L']';
                break;
            case L't':
            case L'T':
                ch = L'\t';
                break;
            case L'r':
            case L'R':
                ch = L'\r';
                break;
            case L'n':
            case L'N':
                ch = L'\n';
                break;
            default:
                throw stream.unexpected(ch);
            }
            escaped = true;
        }
        switch (state)
        {
        case CC_STATE_START:
            if (!escaped && ch == L'-')
                throw stream.unexpected(ch);
            start = ch;
            state = CC_STATE_RANGE;
            break;
        case CC_STATE_RANGE:
            if (!escaped && ch == L'-')
            {
                state = CC_STATE_END;
            }
            else
            {
                *this |= Range<TCHAR>(start, start + 1);
                start = ch;
                state = CC_STATE_RANGE;
            }
            break;
        case CC_STATE_END:
            if (!escaped && ch == L'-')
            {
                throw stream.unexpected(ch);
            }
            else
            {
                *this |= Range<TCHAR>(start, ch + 1);
                state = CC_STATE_START;
            }
            break;
        }
    }
    if (state == CC_STATE_RANGE)
    {
        *this |= Range<TCHAR>(start, start + 1);
    }
    else if (state == CC_STATE_END)
    {
        throw stream.unexpected(L']');
    }

	std::sort(m_ranges.begin(), m_ranges.end());

	if (invert_flag)
	{
		*this = this->operator~();
	}
}